

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.hpp
# Opt level: O0

TwoBSA<unsigned_long> * __thiscall
mxx::right_shift<TwoBSA<unsigned_long>>
          (TwoBSA<unsigned_long> *__return_storage_ptr__,mxx *this,TwoBSA<unsigned_long> *t,
          comm *comm)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  MPI_Datatype poVar4;
  MPI_Comm poVar5;
  undefined1 local_40 [8];
  MPI_Request recv_req;
  undefined1 local_30 [4];
  int tag;
  datatype dt;
  comm *comm_local;
  TwoBSA<unsigned_long> *t_local;
  
  dt._16_8_ = t;
  get_datatype<TwoBSA<unsigned_long>>();
  recv_req._4_4_ = 0xd;
  memset(__return_storage_ptr__,0,0x18);
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar2) {
    poVar4 = datatype::type((datatype *)local_30);
    iVar2 = mxx::comm::rank((comm *)dt._16_8_);
    uVar1 = recv_req._4_4_;
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Irecv(__return_storage_ptr__,1,poVar4,iVar2 + -1,uVar1,poVar5,local_40);
  }
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  iVar3 = mxx::comm::size((comm *)dt._16_8_);
  if (iVar2 < iVar3 + -1) {
    poVar4 = datatype::type((datatype *)local_30);
    iVar2 = mxx::comm::rank((comm *)dt._16_8_);
    uVar1 = recv_req._4_4_;
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Send(this,1,poVar4,iVar2 + 1,uVar1,poVar5);
  }
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar2) {
    MPI_Wait(local_40,0);
  }
  datatype::~datatype((datatype *)local_30);
  return __return_storage_ptr__;
}

Assistant:

T right_shift(const T& t, const mxx::comm& comm = mxx::comm()) {
    // get datatype
    datatype dt = get_datatype<T>();

    // TODO: handle tags with MXX (get unique tag function)
    int tag = 13;

    T left_value = T();
    MPI_Request recv_req;
    // if not last processor
    if (comm.rank() > 0) {
        MPI_Irecv(&left_value, 1, dt.type(), comm.rank()-1, tag,
                  comm, &recv_req);
    }
    // if not first processor
    if (comm.rank() < comm.size()-1) {
        // send my most right element to the right
        MPI_Send(const_cast<T*>(&t), 1, dt.type(), comm.rank()+1, tag, comm);
    }
    if (comm.rank() > 0) {
        // wait for the async receive to finish
        MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
    }
    return left_value;
}